

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::
MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::
GetDescriberImpl<testing::internal::MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::ValuePolicy<testing::internal::EqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>,false>>
          (MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
           *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<vector<Card,_allocator<Card>_>_&>_*,_const_EqMatcher<vector<Card,_allocator<Card>_>_>_*>_>
  *ppMVar1;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  *local_28;
  tuple<const_testing::internal::MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>_*,_const_testing::internal::EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_*>
  local_20;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  *local_10;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ValuePolicy<testing::internal::EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>,_false>
  ::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>const*,testing::internal::EqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>const*>
            ((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
              **)&local_20,
             (EqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
              **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>const*,testing::internal::EqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }